

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void llvm::SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,true>::
     uninitialized_copy<llvm::DWARFDebugMacro::Entry_const,llvm::DWARFDebugMacro::Entry>
               (Entry *I,Entry *E,Entry *Dest,type *param_4)

{
  type *param_3_local;
  Entry *Dest_local;
  Entry *E_local;
  Entry *I_local;
  
  if (I != E) {
    memcpy(Dest,I,(((long)E - (long)I) / 0x18) * 0x18);
  }
  return;
}

Assistant:

static void uninitialized_copy(
      T1 *I, T1 *E, T2 *Dest,
      typename std::enable_if<std::is_same<typename std::remove_const<T1>::type,
                                           T2>::value>::type * = nullptr) {
    // Use memcpy for PODs iterated by pointers (which includes SmallVector
    // iterators): std::uninitialized_copy optimizes to memmove, but we can
    // use memcpy here. Note that I and E are iterators and thus might be
    // invalid for memcpy if they are equal.
    if (I != E)
      memcpy(reinterpret_cast<void *>(Dest), I, (E - I) * sizeof(T));
  }